

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void __thiscall aim_t::AimTraverse(aim_t *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  sector_t *psVar5;
  extsector_t *peVar6;
  F3DFloor **ppFVar7;
  long *plVar8;
  secplane_t *psVar9;
  AActor *t2;
  _func_int **pp_Var10;
  player_t *ppVar11;
  AWeapon *pAVar12;
  double dVar13;
  int iVar14;
  ulong uVar15;
  intercept_t *in;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DAngle *pDVar17;
  AimTarget *res;
  long lVar18;
  bool bVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  int planestocheck;
  FPathTraverse it;
  FLineOpening open;
  DVector2 local_188;
  AimTarget *local_178;
  AimTarget *local_170;
  secplane_t **local_168;
  DAngle local_160;
  DAngle local_158;
  DAngle local_150;
  DAngle local_148;
  DAngle local_140;
  DAngle local_138;
  FPathTraverse local_130;
  DAngle local_f0;
  DAngle local_e8;
  DAngle local_e0;
  DAngle local_d8;
  DAngle local_d0;
  DAngle local_c8;
  FLineOpening local_c0;
  PClass *pPVar16;
  
  *(undefined8 *)&(this->linetarget).super_FTranslatedLineTarget.unlinked = 0;
  (this->linetarget).pitch.Degrees = 0.0;
  (this->linetarget).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->linetarget).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  (this->linetarget).frac = 3.4028234663852886e+38;
  (this->thing_friend).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->thing_friend).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  *(undefined8 *)&(this->thing_friend).super_FTranslatedLineTarget.unlinked = 0;
  (this->thing_friend).pitch.Degrees = 0.0;
  (this->thing_friend).frac = 3.4028234663852886e+38;
  (this->thing_other).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->thing_other).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  *(undefined8 *)&(this->thing_other).super_FTranslatedLineTarget.unlinked = 0;
  (this->thing_other).pitch.Degrees = 0.0;
  (this->thing_other).frac = 3.4028234663852886e+38;
  psVar5 = this->lastsector;
  peVar6 = psVar5->e;
  uVar15 = (ulong)(peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  this->crossedffloors = uVar15 != 0;
  this->lastfloorplane = (secplane_t *)0x0;
  this->lastceilingplane = (secplane_t *)0x0;
  dVar24 = (this->toppitch).Degrees;
  bVar19 = false;
  if (((this->aimdir & 1U) != 0) && (bVar19 = false, dVar24 < 0.0)) {
    bVar19 = (psVar5->planes[1].Flags & 0x1d0U) == 0x100;
  }
  dVar23 = (this->bottompitch).Degrees;
  bVar20 = false;
  if (((this->aimdir & 2U) != 0) && (bVar20 = false, 0.0 < dVar23)) {
    bVar20 = (psVar5->planes[0].Flags & 0x1d0U) == 0x100;
  }
  if (uVar15 != 0) {
    ppFVar7 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    dVar3 = (this->startpos).X;
    dVar13 = (this->startpos).Y;
    dVar2 = (this->startpos).Z;
    lVar18 = 0;
    do {
      plVar8 = *(long **)((long)ppFVar7 + lVar18);
      if ((*(uint *)(plVar8 + 0xb) & 0x4000001) == 1) {
        psVar9 = (secplane_t *)*plVar8;
        if (this->shootthing->Height + dVar2 <=
            ((psVar9->normal).Y * dVar13 + psVar9->D + (psVar9->normal).X * dVar3) * psVar9->negiC)
        {
          this->lastceilingplane = psVar9;
          bVar19 = false;
        }
        psVar9 = (secplane_t *)plVar8[5];
        if (((psVar9->normal).Y * dVar13 + psVar9->D + (psVar9->normal).X * dVar3) * psVar9->negiC
            <= dVar2) {
          this->lastfloorplane = psVar9;
          bVar20 = false;
        }
      }
      lVar18 = lVar18 + 8;
    } while (uVar15 << 3 != lVar18);
  }
  if (bVar19) {
    uVar21 = 0;
    uVar22 = 0;
    if (dVar23 <= 0.0) {
      uVar21 = SUB84(dVar23,0);
      uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
    }
    local_d0.Degrees = (double)CONCAT44(uVar22,uVar21);
    local_c8.Degrees = dVar24;
    EnterSectorPortal(this,1,0.0,psVar5,&local_c8,&local_d0);
  }
  if (bVar20) {
    uVar21 = 0;
    uVar22 = 0;
    dVar24 = (this->toppitch).Degrees;
    if (0.0 <= dVar24) {
      uVar21 = SUB84(dVar24,0);
      uVar22 = (undefined4)((ulong)dVar24 >> 0x20);
    }
    local_d8.Degrees = (double)CONCAT44(uVar22,uVar21);
    local_e0.Degrees = (this->bottompitch).Degrees;
    EnterSectorPortal(this,0,0.0,this->lastsector,&local_d8,&local_e0);
  }
  local_130._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_00872258;
  local_168 = &this->lastfloorplane;
  FPathTraverse::init(&local_130,(EVP_PKEY_CTX *)0xf);
  if (aimdebug.Value == true) {
    Printf("Start AimTraverse, start = %f,%f,%f, vect = %f,%f\n",
           SUB84((this->startpos).X * 1.52587890625e-05,0),(this->startpos).Y * 1.52587890625e-05,
           (this->startpos).Z * 1.52587890625e-05,(this->aimtrace).X * 1.52587890625e-05,
           (this->aimtrace).Y * 1.52587890625e-05);
  }
  local_170 = &this->thing_friend;
  local_178 = &this->thing_other;
LAB_00544a3b:
  do {
    while( true ) {
      in = FPathTraverse::Next(&local_130);
      if ((in == (intercept_t *)0x0) ||
         (((this->linetarget).super_FTranslatedLineTarget.linetarget != (AActor *)0x0 &&
          (pdVar1 = &(this->linetarget).frac, *pdVar1 <= in->frac && in->frac != *pdVar1))))
      goto LAB_00545279;
      t2 = (in->d).thing;
      if (in->isaline != true) break;
      pp_Var10 = (t2->super_DThinker).super_DObject._vptr_DObject;
      dVar24 = (double)(t2->super_DThinker).super_DObject.GCNext *
               ((double)*pp_Var10 - (this->startpos).X) +
               (double)(t2->super_DThinker).super_DObject.ObjNext *
               ((this->startpos).Y - (double)pp_Var10[1]);
      if (aimdebug.Value == true) {
        Printf("Found line %d: ___toppitch = %f, ___bottompitch = %f\n",
               SUB84((this->toppitch).Degrees,0),(this->bottompitch).Degrees);
      }
      uVar4 = *(uint *)&(t2->Angles).Yaw.Degrees;
      if (((uVar4 < linePortals.Count) && (dVar24 <= 1.52587890625e-05)) &&
         ((linePortals.Array[uVar4].mFlags & 2) != 0)) {
        EnterLinePortal(this,(line_t *)t2,in->frac);
        goto LAB_00545279;
      }
      if (((t2->super_DThinker).super_DObject.ObjectFlags & 0x8004) != 4) goto LAB_00545279;
      local_188.X = in->frac * local_130.trace.dx + local_130.trace.x;
      local_188.Y = in->frac * local_130.trace.dy + local_130.trace.y;
      P_LineOpening(&local_c0,(AActor *)0x0,(line_t *)t2,&local_188,(DVector2 *)0x0,0x100);
      if ((local_c0.range <= 0.0) || (local_c0.top <= local_c0.bottom)) goto LAB_00545279;
      dVar23 = this->attackrange * in->frac;
      if ((local_c0.bottom != -3.4028234663852886e+38) || (NAN(local_c0.bottom))) {
        dVar2 = c_atan2(local_c0.bottom - this->shootz,dVar23);
        if (dVar2 * -57.29577951308232 < (this->bottompitch).Degrees) {
          (this->bottompitch).Degrees = dVar2 * -57.29577951308232;
        }
      }
      if ((local_c0.top != 3.4028234663852886e+38) || (NAN(local_c0.top))) {
        dVar2 = c_atan2(local_c0.top - this->shootz,dVar23);
        dVar2 = dVar2 * -57.29577951308232;
        dVar23 = (this->toppitch).Degrees;
        if (dVar23 < dVar2) {
          (this->toppitch).Degrees = dVar2;
          dVar23 = dVar2;
        }
      }
      else {
        dVar23 = (this->toppitch).Degrees;
      }
      if (((this->bottompitch).Degrees <= dVar23) ||
         (bVar19 = AimTraverse3DFloors(this,&local_130.trace,in,(uint)(1.52587890625e-05 < dVar24),
                                       (int *)&local_188), !bVar19)) goto LAB_00545279;
      if (aimdebug.Value == true) {
        Printf("After line %d: toppitch = %f, bottompitch = %f, planestocheck = %d\n",
               SUB84((this->toppitch).Degrees,0),(this->bottompitch).Degrees,
               (ulong)(uint)((int)((ulong)((long)t2 - (long)lines) >> 3) * 0x286bca1b),
               (ulong)local_188.X & 0xffffffff);
      }
      psVar5 = (sector_t *)(&t2->SpriteAngle)[dVar24 <= 1.52587890625e-05].Degrees;
      this->lastsector = psVar5;
      if ((((((ulong)local_188.X & 1) != 0) && (dVar24 = (this->toppitch).Degrees, dVar24 < 0.0)) &&
          ((local_c0.top != 3.4028234663852886e+38 || (NAN(local_c0.top))))) &&
         ((psVar5->planes[1].Flags & 0x1d0U) == 0x100)) {
        dVar23 = (this->bottompitch).Degrees;
        local_140.Degrees = 0.0;
        if (dVar23 <= 0.0) {
          local_140.Degrees = dVar23;
        }
        local_138.Degrees = dVar24;
        EnterSectorPortal(this,1,in->frac,psVar5,&local_138,&local_140);
      }
      if ((((local_188.X._0_4_ & 2) != 0) && (dVar24 = (this->bottompitch).Degrees, 0.0 < dVar24))
         && (((local_c0.bottom != -3.4028234663852886e+38 || (NAN(local_c0.bottom))) &&
             ((psVar5->planes[0].Flags & 0x1d0U) == 0x100)))) {
        dVar23 = (this->toppitch).Degrees;
        local_148.Degrees = 0.0;
        if (0.0 <= dVar23) {
          local_148.Degrees = dVar23;
        }
        local_150.Degrees = dVar24;
        EnterSectorPortal(this,0,in->frac,psVar5,&local_148,&local_150);
      }
    }
  } while ((t2 == this->shootthing) || (this->aimtarget != (AActor *)0x0 && t2 != this->aimtarget));
  uVar4 = this->flags;
  if ((uVar4 & 8) == 0) {
    if ((uVar4 & 4) == 0) {
LAB_00544e2b:
      if ((((t2->flags).Value & 4) == 0) ||
         ((((((t2->flags3).Value & 8) != 0 &&
            (ppVar11 = this->shootthing->player, ppVar11 != (player_t *)0x0)) &&
           (pAVar12 = ppVar11->ReadyWeapon, pAVar12 != (AWeapon *)0x0)) &&
          (((pAVar12->super_AInventory).super_AActor.flags2.Value & 0x4000) != 0))))
      goto LAB_00544a3b;
    }
  }
  else if (((uVar4 & 4) == 0) && (t2->Conversation == (FStrifeDialogueNode *)0x0))
  goto LAB_00544e2b;
  dVar24 = this->attackrange * in->frac;
  if ((cl_doautoaim.Value != false) || (((t2->flags6).Value & 0x20000000) == 0)) {
    if ((this->lastsector == t2->Sector) &&
       ((t2->Sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0)) {
      psVar9 = this->lastceilingplane;
      if (psVar9 != (secplane_t *)0x0) {
        dVar23 = c_atan2(((psVar9->normal).Y * (t2->__Pos).Y +
                         (psVar9->normal).X * (t2->__Pos).X + psVar9->D) * psVar9->negiC -
                         this->shootz,dVar24);
        dVar23 = dVar23 * -57.29577951308232;
        if ((this->toppitch).Degrees <= dVar23 && dVar23 != (this->toppitch).Degrees) {
          (this->toppitch).Degrees = dVar23;
        }
      }
      psVar9 = *local_168;
      if (psVar9 != (secplane_t *)0x0) {
        dVar23 = c_atan2(((psVar9->normal).Y * (t2->__Pos).Y +
                         (psVar9->normal).X * (t2->__Pos).X + psVar9->D) * psVar9->negiC -
                         this->shootz,dVar24);
        if (dVar23 * -57.29577951308232 < (this->bottompitch).Degrees) {
          (this->bottompitch).Degrees = dVar23 * -57.29577951308232;
        }
      }
    }
    dVar23 = c_atan2(((t2->__Pos).Z + t2->Height) - this->shootz,dVar24);
    dVar23 = dVar23 * -57.29577951308232;
    if (dVar23 < (this->bottompitch).Degrees || dVar23 == (this->bottompitch).Degrees) {
      dVar2 = c_atan2((t2->__Pos).Z - this->shootz,dVar24);
      dVar2 = dVar2 * -57.29577951308232;
      dVar24 = (this->toppitch).Degrees;
      if (dVar24 <= dVar2) {
        if ((this->crossedffloors == true) && (this->unlinked == false)) {
          bVar19 = P_CheckSight(this->shootthing,t2,9);
          dVar24 = (this->toppitch).Degrees;
          if (bVar19) goto LAB_00544f40;
          if (dVar24 <= dVar23) {
            dVar3 = (this->bottompitch).Degrees;
            if ((dVar3 < dVar2) && (dVar23 < dVar3)) {
              (this->bottompitch).Degrees = dVar23;
            }
          }
          else if (dVar24 < dVar2) {
            (this->toppitch).Degrees = dVar2;
            dVar24 = dVar2;
          }
          if ((this->bottompitch).Degrees <= dVar24) {
LAB_00545279:
            FPathTraverse::~FPathTraverse(&local_130);
            return;
          }
        }
        else {
LAB_00544f40:
          if (dVar24 <= dVar23) {
            dVar24 = dVar23;
          }
          dVar23 = (this->bottompitch).Degrees;
          if (dVar2 <= dVar23) {
            dVar23 = dVar2;
          }
          dVar24 = dVar23 * 0.5 + dVar24 * 0.5;
          if ((this->flags & 2) != 0) {
            dVar23 = FFastTrig::cos(&fasttrig,dVar24 * 11930464.711111112 + 6755399441055744.0);
            if (((dVar23 != 0.0) || (NAN(dVar23))) &&
               (dVar2 = c_sqrt(local_130.trace.dy * local_130.trace.dy +
                               local_130.trace.dx * local_130.trace.dx),
               dVar23 = (dVar2 * in->frac) / dVar23,
               this->attackrange <= dVar23 && dVar23 != this->attackrange)) goto LAB_00545279;
          }
          if (((this->flags & 0x10) == 0) ||
             (bVar19 = AActor::IsFriend(t2,this->friender),
             !bVar19 || this->aimtarget != (AActor *)0x0)) {
            if ((sv_smartaim.Value == 0) ||
               (((this->flags & 1) != 0 || (this->aimtarget != (AActor *)0x0)))) {
              if (aimdebug.Value == true) {
                pPVar16 = (t2->super_DThinker).super_DObject.Class;
                if (pPVar16 == (PClass *)0x0) {
                  iVar14 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
                  pPVar16 = (PClass *)CONCAT44(extraout_var_01,iVar14);
                  (t2->super_DThinker).super_DObject.Class = pPVar16;
                }
                Printf("Hit target %s at %f,%f,%f\n",SUB84((t2->__Pos).X,0),(t2->__Pos).Y,
                       (t2->__Pos).Z,
                       FName::NameData.NameArray
                       [(pPVar16->super_PStruct).super_PNamedType.TypeName.Index].Text);
              }
              uVar21 = SUB84(in->frac,0);
              uVar22 = (undefined4)((ulong)in->frac >> 0x20);
              pDVar17 = &local_f0;
LAB_0054535d:
              pDVar17->Degrees = dVar24;
              SetResult(this,&this->linetarget,(double)CONCAT44(uVar22,uVar21),t2,pDVar17);
              goto LAB_00545279;
            }
            bVar19 = AActor::IsFriend(t2,this->friender);
            if (bVar19) {
              if (1 < sv_smartaim.Value) goto LAB_00544a3b;
              if (aimdebug.Value == true) {
                pPVar16 = (t2->super_DThinker).super_DObject.Class;
                if (pPVar16 == (PClass *)0x0) {
                  iVar14 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
                  pPVar16 = (PClass *)CONCAT44(extraout_var,iVar14);
                  (t2->super_DThinker).super_DObject.Class = pPVar16;
                }
                Printf("Hit friend %s at %f,%f,%f\n",SUB84((t2->__Pos).X,0),(t2->__Pos).Y,
                       (t2->__Pos).Z,
                       FName::NameData.NameArray
                       [(pPVar16->super_PStruct).super_PNamedType.TypeName.Index].Text);
              }
              uVar21 = SUB84(in->frac,0);
              uVar22 = (undefined4)((ulong)in->frac >> 0x20);
              pDVar17 = &local_158;
              res = local_170;
              local_158.Degrees = dVar24;
            }
            else {
              if ((((t2->flags3).Value & 0x2000) != 0) || (t2->player != (player_t *)0x0)) {
                if (aimdebug.Value == true) {
                  pPVar16 = (t2->super_DThinker).super_DObject.Class;
                  if (pPVar16 == (PClass *)0x0) {
                    iVar14 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
                    pPVar16 = (PClass *)CONCAT44(extraout_var_02,iVar14);
                    (t2->super_DThinker).super_DObject.Class = pPVar16;
                  }
                  Printf("Hit target %s at %f,%f,%f\n",SUB84((t2->__Pos).X,0),(t2->__Pos).Y,
                         (t2->__Pos).Z,
                         FName::NameData.NameArray
                         [(pPVar16->super_PStruct).super_PNamedType.TypeName.Index].Text);
                }
                uVar21 = SUB84(in->frac,0);
                uVar22 = (undefined4)((ulong)in->frac >> 0x20);
                pDVar17 = &local_e8;
                goto LAB_0054535d;
              }
              if (2 < sv_smartaim.Value) goto LAB_00544a3b;
              if (aimdebug.Value == true) {
                pPVar16 = (t2->super_DThinker).super_DObject.Class;
                if (pPVar16 == (PClass *)0x0) {
                  iVar14 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
                  pPVar16 = (PClass *)CONCAT44(extraout_var_00,iVar14);
                  (t2->super_DThinker).super_DObject.Class = pPVar16;
                }
                Printf("Hit other %s at %f,%f,%f\n",SUB84((t2->__Pos).X,0),(t2->__Pos).Y,
                       (t2->__Pos).Z,
                       FName::NameData.NameArray
                       [(pPVar16->super_PStruct).super_PNamedType.TypeName.Index].Text);
              }
              uVar21 = SUB84(in->frac,0);
              uVar22 = (undefined4)((ulong)in->frac >> 0x20);
              pDVar17 = &local_160;
              res = local_178;
              local_160.Degrees = dVar24;
            }
            SetResult(this,res,(double)CONCAT44(uVar22,uVar21),t2,pDVar17);
          }
        }
      }
    }
  }
  goto LAB_00544a3b;
}

Assistant:

void AimTraverse()
	{
		// for smart aiming
		linetarget.Clear();
		thing_friend.Clear();
		thing_other.Clear();
		crossedffloors = lastsector->e->XFloor.ffloors.Size() != 0;
		lastfloorplane = lastceilingplane = NULL;

		// check the initial sector for 3D-floors and portals
		bool ceilingportalstate = (aimdir & aim_t::aim_up) && toppitch < 0 && !lastsector->PortalBlocksMovement(sector_t::ceiling);
		bool floorportalstate = (aimdir & aim_t::aim_down) && bottompitch > 0 && !lastsector->PortalBlocksMovement(sector_t::floor);

		for (auto rover : lastsector->e->XFloor.ffloors)
		{
			if ((rover->flags & FF_SHOOTTHROUGH) || !(rover->flags & FF_EXISTS)) continue;

			double bottomz = rover->bottom.plane->ZatPoint(startpos);

			if (bottomz >= startpos.Z + shootthing->Height)
			{
				lastceilingplane = rover->bottom.plane;
				// no ceiling portal if below a 3D floor
				ceilingportalstate = false;
			}

			bottomz = rover->top.plane->ZatPoint(startpos);
			if (bottomz <= startpos.Z)
			{
				lastfloorplane = rover->top.plane;
				// no floor portal if above a 3D floor
				floorportalstate = false;
			}
		}
		if (ceilingportalstate) EnterSectorPortal(sector_t::ceiling, 0, lastsector, toppitch, MIN<DAngle>(0., bottompitch));
		if (floorportalstate) EnterSectorPortal(sector_t::floor, 0, lastsector, MAX<DAngle>(0., toppitch), bottompitch);

		FPathTraverse it(startpos.X, startpos.Y, aimtrace.X, aimtrace.Y, PT_ADDLINES | PT_ADDTHINGS | PT_COMPATIBLE | PT_DELTA, startfrac);
		intercept_t *in;

		if (aimdebug)
			Printf("Start AimTraverse, start = %f,%f,%f, vect = %f,%f\n",
				startpos.X / 65536., startpos.Y / 65536., startpos.Z / 65536.,
				aimtrace.X / 65536., aimtrace.Y / 65536.);
		
		while ((in = it.Next()))
		{
			line_t* 			li;
			AActor* 			th;
			DAngle	 			pitch;
			DAngle				thingtoppitch;
			DAngle 				thingbottompitch;
			double 				dist;
			DAngle				thingpitch;

			if (linetarget.linetarget != NULL && in->frac > linetarget.frac) return;	// we already found something better in another portal section.

			if (in->isaline)
			{
				li = in->d.line;
				int frontflag = P_PointOnLineSidePrecise(startpos, li);

				if (aimdebug)
					Printf("Found line %d: ___toppitch = %f, ___bottompitch = %f\n", int(li - lines), toppitch.Degrees, bottompitch.Degrees);

				if (li->isLinePortal() && frontflag == 0)
				{
					EnterLinePortal(li, in->frac);
					return;
				}


				if (!(li->flags & ML_TWOSIDED) || (li->flags & ML_BLOCKEVERYTHING))
					return;				// stop

				// Crosses a two sided line.
				// A two sided line will restrict the possible target ranges.
				FLineOpening open;
				P_LineOpening(open, NULL, li, it.InterceptPoint(in), (DVector2*)nullptr, FFCF_NODROPOFF);

				// The following code assumes that portals on the front of the line have already been processed.

				if (open.range <= 0 || open.bottom >= open.top)
					return;
					
				dist = attackrange * in->frac;

				if (open.bottom != LINEOPEN_MIN)
				{
					pitch = -VecToAngle(dist, open.bottom - shootz);
					if (pitch < bottompitch) bottompitch = pitch;
				}

				if (open.top != LINEOPEN_MAX)
				{
					pitch = -VecToAngle(dist, open.top - shootz);
					if (pitch > toppitch) toppitch = pitch;
				}

				if (toppitch >= bottompitch)
					return;

				int planestocheck;
				if (!AimTraverse3DFloors(it.Trace(), in, frontflag, &planestocheck))
					return;

				if (aimdebug)
					Printf("After line %d: toppitch = %f, bottompitch = %f, planestocheck = %d\n", int(li - lines), toppitch.Degrees, bottompitch.Degrees, planestocheck);

				sector_t *entersec = frontflag ? li->frontsector : li->backsector;
				sector_t *exitsec = frontflag ? li->backsector : li->frontsector;
				lastsector = entersec;
				// check portal in backsector when aiming up/downward is possible, the line doesn't have portals on both sides and there's actually a portal in the backsector
				if ((planestocheck & aim_up) && toppitch < 0 && open.top != LINEOPEN_MAX && !entersec->PortalBlocksMovement(sector_t::ceiling))
				{
					EnterSectorPortal(sector_t::ceiling, in->frac, entersec, toppitch, MIN<DAngle>(0., bottompitch));
				}
				if ((planestocheck & aim_down) && bottompitch > 0 && open.bottom != LINEOPEN_MIN && !entersec->PortalBlocksMovement(sector_t::floor))
				{
					EnterSectorPortal(sector_t::floor, in->frac, entersec, MAX<DAngle>(0., toppitch), bottompitch);
				}
				continue;					// shot continues
			}

			// shoot a thing
			th = in->d.thing;
			if (th == shootthing)
				continue;					// can't shoot self

			if (aimtarget != NULL && th != aimtarget)
				continue;					// only care about target, and you're not it

			// If we want to start a conversation anything that has one should be
			// found, regardless of other settings.
			if (!(flags & ALF_CHECKCONVERSATION) || th->Conversation == NULL)
			{
				if (!(flags & ALF_CHECKNONSHOOTABLE))			// For info CCMD, ignore stuff about GHOST and SHOOTABLE flags
				{
					if (!(th->flags&MF_SHOOTABLE))
						continue;					// corpse or something

					// check for physical attacks on a ghost
					if ((th->flags3 & MF3_GHOST) &&
						shootthing->player &&	// [RH] Be sure shootthing is a player
						shootthing->player->ReadyWeapon &&
						(shootthing->player->ReadyWeapon->flags2 & MF2_THRUGHOST))
					{
						continue;
					}
				}
			}
			dist = attackrange * in->frac;

			// Don't autoaim certain special actors
			if (!cl_doautoaim && th->flags6 & MF6_NOTAUTOAIMED)
			{
				continue;
			}

			// we must do one last check whether the trace has crossed a 3D floor
			if (lastsector == th->Sector && th->Sector->e->XFloor.ffloors.Size())
			{
				if (lastceilingplane)
				{
					double ff_top = lastceilingplane->ZatPoint(th);
					DAngle pitch = -VecToAngle(dist, ff_top - shootz);
					// upper slope intersects with this 3d-floor
					if (pitch > toppitch)
					{
						toppitch = pitch;
					}
				}
				if (lastfloorplane)
				{
					double ff_bottom = lastfloorplane->ZatPoint(th);
					DAngle pitch = -VecToAngle(dist, ff_bottom - shootz);
					// lower slope intersects with this 3d-floor
					if (pitch < bottompitch)
					{
						bottompitch = pitch;
					}
				}
			}

			// check angles to see if the thing can be aimed at

			thingtoppitch = -VecToAngle(dist, th->Top() - shootz);

			if (thingtoppitch > bottompitch)
				continue;					// shot over the thing

			thingbottompitch = -VecToAngle(dist, th->Z() - shootz);

			if (thingbottompitch < toppitch)
				continue;					// shot under the thing

			if (crossedffloors)
			{
				// if 3D floors were in the way do an extra visibility check for safety
				if (!unlinked && !P_CheckSight(shootthing, th, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY))
				{
					// the thing can't be seen so we can safely exclude its range from our aiming field
					if (thingtoppitch < toppitch)
					{
						if (thingbottompitch > toppitch) toppitch = thingbottompitch;
					}
					else if (thingbottompitch>bottompitch)
					{
						if (thingtoppitch < bottompitch) bottompitch = thingtoppitch;
					}
					if (toppitch < bottompitch) continue;
					else return;
				}
			}

			// this thing can be hit!
			if (thingtoppitch < toppitch)
				thingtoppitch = toppitch;

			if (thingbottompitch > bottompitch)
				thingbottompitch = bottompitch;

			thingpitch = thingtoppitch / 2 + thingbottompitch / 2;

			if (flags & ALF_CHECK3D)
			{
				// We need to do a 3D distance check here because this is nearly always used in
				// combination with P_LineAttack. P_LineAttack uses 3D distance but FPathTraverse
				// only 2D. This causes some problems with Hexen's weapons that use different
				// attack modes based on distance to target
				double cosine = thingpitch.Cos();
				if (cosine != 0)
				{
					double tracelen = DVector2(it.Trace().dx, it.Trace().dy).Length();
					double d3 = tracelen * in->frac / cosine;
					if (d3 > attackrange)
					{
						return;
					}
				}
			}

			if ((flags & ALF_NOFRIENDS) && th->IsFriend(friender) && aimtarget == NULL)
			{
				continue;
			}
			else if (sv_smartaim != 0 && !(flags & ALF_FORCENOSMART) && aimtarget == NULL)
			{
				// try to be a little smarter about what to aim at!
				// In particular avoid autoaiming at friends and barrels.
				if (th->IsFriend(friender))
				{
					if (sv_smartaim < 2)
					{
						// friends don't aim at friends (except players), at least not first
						if (aimdebug)
							Printf("Hit friend %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
						SetResult(thing_friend, in->frac, th, thingpitch);
					}
				}
				else if (!(th->flags3 & MF3_ISMONSTER) && th->player == NULL)
				{
					if (sv_smartaim < 3)
					{
						// don't autoaim at barrels and other shootable stuff unless no monsters have been found
						if (aimdebug)
							Printf("Hit other %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
						SetResult(thing_other, in->frac, th, thingpitch);
					}
				}
				else
				{
					if (aimdebug)
						Printf("Hit target %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
					SetResult(linetarget, in->frac, th, thingpitch);
					return;
				}
			}
			else
			{
				if (aimdebug)
					Printf("Hit target %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
				SetResult(linetarget, in->frac, th, thingpitch);
				return;
			}
		}
	}